

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intra_mode_search.c
# Opt level: O1

double intra_rd_variance_factor(AV1_COMP *cpi,MACROBLOCK *x,BLOCK_SIZE bs)

{
  Block4x4VarInfo *pBVar1;
  BLOCK_SIZE BVar2;
  byte bVar3;
  int iVar4;
  aom_variance_fn_t p_Var5;
  int iVar6;
  int iVar7;
  uint uVar8;
  long lVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  uint8_t *puVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  double dVar16;
  undefined8 uVar17;
  double dVar18;
  double dVar19;
  undefined1 auVar20 [16];
  double dVar21;
  uint sse;
  uint sse_1;
  int local_90;
  uint local_68;
  uint local_60;
  uint local_5c;
  double local_58;
  undefined8 uStack_50;
  undefined1 local_48 [24];
  
  uVar14 = 0;
  uVar15 = 0x3ff00000;
  dVar18 = (double)(cpi->oxcf).speed * -0.25 + 1.0;
  if (0.0 < dVar18) {
    iVar6 = (x->e_mbd).mb_to_right_edge;
    iVar7 = (x->e_mbd).mb_to_bottom_edge;
    uVar8 = iVar7 >> 0x1f & (uint)-iVar7 >> 3;
    lVar9 = (ulong)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[bs]
            * 4 - (ulong)(iVar6 >> 0x1f & (uint)-iVar6 >> 3);
    iVar6 = (uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"[bs] *
            4 - uVar8;
    local_90 = (int)lVar9;
    if (iVar6 == 0 ||
        (uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"[bs] * 4 <
        uVar8) {
      local_48._0_16_ = ZEXT816(0);
    }
    else {
      BVar2 = ((cpi->common).seq_params)->sb_size;
      bVar3 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[BVar2];
      p_Var5 = cpi->ppi->fn_ptr[0].vf;
      puVar13 = "";
      if ((((x->e_mbd).cur_buf)->flags & 8) != 0) {
        puVar13 = (uint8_t *)0x28ab78;
      }
      iVar10 = ("\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"[BVar2]
                - 1 & (x->e_mbd).mi_row) * (uint)bVar3 + (bVar3 - 1 & (x->e_mbd).mi_col);
      local_48._0_16_ = ZEXT816(0);
      iVar7 = 0;
      do {
        if (0 < local_90) {
          lVar12 = 0;
          iVar11 = iVar10;
          do {
            pBVar1 = x->src_var_info_of_4x4_sub_blocks + iVar11;
            uVar8 = x->src_var_info_of_4x4_sub_blocks[iVar11].var;
            if ((int)uVar8 < 0) {
              iVar4 = x->plane[0].src.stride;
              uVar8 = (*p_Var5)(x->plane[0].src.buf + lVar12 + iVar7 * iVar4,iVar4,puVar13,0,
                                &local_60);
              pBVar1->var = uVar8;
LAB_00251a1b:
              dVar21 = log1p((double)(int)uVar8 * 0.0625);
              uVar17 = CONCAT44(extraout_XMM0_Dd,extraout_XMM0_Dc);
              pBVar1->log_var = dVar21;
            }
            else {
              dVar21 = pBVar1->log_var;
              uVar17 = 0;
              if (dVar21 < 0.0) goto LAB_00251a1b;
            }
            iVar4 = (x->e_mbd).plane[0].dst.stride;
            local_58 = dVar21;
            uStack_50 = uVar17;
            uVar8 = (*p_Var5)((x->e_mbd).plane[0].dst.buf + lVar12 + iVar7 * iVar4,iVar4,puVar13,0,
                              &local_5c);
            dVar21 = log1p((double)(int)uVar8 * 0.0625);
            local_48._0_8_ = (double)local_48._0_8_ + local_58;
            local_48._8_8_ = (double)local_48._8_8_ + dVar21;
            lVar12 = lVar12 + 4;
            iVar11 = iVar11 + 1;
          } while (lVar12 < lVar9);
        }
        iVar7 = iVar7 + 4;
        local_68 = (uint)bVar3;
        iVar10 = iVar10 + local_68;
      } while (iVar7 < iVar6);
    }
    iVar6 = iVar6 * local_90;
    iVar7 = iVar6 + 0xf;
    if (-1 < iVar6) {
      iVar7 = iVar6;
    }
    dVar21 = (double)(iVar7 >> 4);
    auVar20._8_4_ = SUB84(dVar21,0);
    auVar20._0_8_ = dVar21;
    auVar20._12_4_ = (int)((ulong)dVar21 >> 0x20);
    auVar20 = divpd(local_48._0_16_,auVar20);
    dVar19 = auVar20._0_8_ + 1e-06;
    dVar21 = auVar20._8_8_ + 1e-06;
    if (dVar21 <= dVar19) {
      dVar16 = 1.0;
      if ((dVar21 < dVar18) && (dVar21 = dVar19 - dVar21, 0.5 < dVar21)) {
        dVar16 = (dVar21 + dVar21) / dVar19 + 1.0;
      }
    }
    else {
      dVar16 = 1.0;
      if ((dVar19 < dVar18) && (0.5 < dVar21 - dVar19)) {
        dVar16 = (dVar21 - dVar19) / (dVar19 + dVar19) + 1.0;
      }
    }
    uVar14 = 0;
    uVar15 = 0x40080000;
    if (dVar16 <= 3.0) {
      uVar14 = SUB84(dVar16,0);
      uVar15 = (undefined4)((ulong)dVar16 >> 0x20);
    }
  }
  return (double)CONCAT44(uVar15,uVar14);
}

Assistant:

static double intra_rd_variance_factor(const AV1_COMP *cpi, MACROBLOCK *x,
                                       BLOCK_SIZE bs) {
  double threshold = INTRA_RD_VAR_THRESH(cpi->oxcf.speed);
  // For non-positive threshold values, the comparison of source and
  // reconstructed variances with threshold evaluates to false
  // (src_var < threshold/rec_var < threshold) as these metrics are greater than
  // than 0. Hence further calculations are skipped.
  if (threshold <= 0) return 1.0;

  double variance_rd_factor = 1.0;
  double avg_log_src_variance = 0.0;
  double avg_log_recon_variance = 0.0;
  double var_diff = 0.0;

  compute_avg_log_variance(cpi, x, bs, &avg_log_src_variance,
                           &avg_log_recon_variance);

  // Dont allow 0 to prevent / 0 below.
  avg_log_src_variance += 0.000001;
  avg_log_recon_variance += 0.000001;

  if (avg_log_src_variance >= avg_log_recon_variance) {
    var_diff = (avg_log_src_variance - avg_log_recon_variance);
    if ((var_diff > 0.5) && (avg_log_recon_variance < threshold)) {
      variance_rd_factor = 1.0 + ((var_diff * 2) / avg_log_src_variance);
    }
  } else {
    var_diff = (avg_log_recon_variance - avg_log_src_variance);
    if ((var_diff > 0.5) && (avg_log_src_variance < threshold)) {
      variance_rd_factor = 1.0 + (var_diff / (2 * avg_log_src_variance));
    }
  }

  // Limit adjustment;
  variance_rd_factor = AOMMIN(3.0, variance_rd_factor);

  return variance_rd_factor;
}